

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>>
          (Section *this,string *label,shared_ptr<mocker::nasm::MemoryAddr> *args,
          shared_ptr<mocker::nasm::Addr> *args_1)

{
  shared_ptr<mocker::nasm::MemoryAddr> local_38;
  shared_ptr<mocker::nasm::Addr> *local_28;
  shared_ptr<mocker::nasm::Addr> *args_local_1;
  shared_ptr<mocker::nasm::MemoryAddr> *args_local;
  string *label_local;
  Section *this_local;
  
  local_28 = args_1;
  args_local_1 = (shared_ptr<mocker::nasm::Addr> *)args;
  args_local = (shared_ptr<mocker::nasm::MemoryAddr> *)label;
  label_local = &this->name;
  std::
  make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>>
            (&local_38,(shared_ptr<mocker::nasm::Addr> *)args);
  std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
  emplace_back<std::__cxx11::string,std::shared_ptr<mocker::nasm::Mov>>
            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,label,
             (shared_ptr<mocker::nasm::Mov> *)&local_38);
  std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)&local_38);
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }